

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ts_message.c
# Opt level: O0

TsStatus_t ts_message_get(TsMessageRef_t message,TsPathNode_t field,TsMessageRef_t *value)

{
  TsStatus_t TVar1;
  TsMessageRef_t *value_local;
  TsPathNode_t field_local;
  TsMessageRef_t message_local;
  
  TVar1 = ts_message_has(message,field,value);
  return TVar1;
}

Assistant:

static TsStatus_t _ts_message_get(TsMessageRef_t message, TsPathNode_t field, TsType_t type, TsValue_t value)
{
	TsMessageRef_t object;
	if (ts_message_has(message, field, &object) == TsStatusOk) {

		/* automatic type promotion */
		switch (object->type) {

		case TsTypeInteger: {
			switch (type) {
			case TsTypeInteger:
				*((int *) (value)) = object->value._xinteger;
				return TsStatusOk;
			case TsTypeFloat:
				*((float *) (value)) = (float) (object->value._xinteger);
				return TsStatusOk;
			default:
				return TsStatusErrorPreconditionFailed;
			}
		}

		case TsTypeFloat: {
			switch (type) {
			case TsTypeInteger:
				*((int *) (value)) = (int) (object->value._xfloat);
				return TsStatusOk;
			case TsTypeFloat:
				*((float *) (value)) = object->value._xfloat;
				return TsStatusOk;
			default:
				return TsStatusErrorPreconditionFailed;
			}
		}

		default:
			/* do nothing */
			break;
		}

		/* strict type checks, no promotion */
		if (type != object->type) {
			return TsStatusErrorPreconditionFailed;
		}
		switch (object->type) {

		case TsTypeBoolean:
			*((bool *) (value)) = object->value._xboolean;
			return TsStatusOk;

		case TsTypeString:
			*((char **) (value)) = object->value._xstring;
			return TsStatusOk;

		case TsTypeMessage:
		case TsTypeArray:
			*((TsMessageRef_t *) (value)) = object;
			return TsStatusOk;

		default:
			/* do nothing */
			break;
		}

		/* type not matched (e.g., null) */
		return TsStatusErrorPreconditionFailed;
	}

	/* field not found */
	return TsStatusErrorNotFound;
}